

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::Check<float,4,true,3u>
          (StorageMultisampleTest *this)

{
  ulong uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLfloat *pGVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  allocator_type local_29;
  vector<float,_std::allocator<float>_> result;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  std::vector<float,_std::allocator<float>_>::vector(&result,0x60,&local_29);
  (**(code **)(lVar4 + 0xb8))(0x8c1a,this->m_to_aux);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd46);
  (**(code **)(lVar4 + 0xaa0))
            (0x8c1a,0,0x1908,0x1406,
             result.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd4a);
  pGVar5 = Reference::ReferenceData<float,_true>::reference;
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 0x60) break;
    fVar7 = result.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar6] - *pGVar5;
    fVar8 = -fVar7;
    if (-fVar7 <= fVar7) {
      fVar8 = fVar7;
    }
    pGVar5 = pGVar5 + 1;
    uVar1 = uVar6 + 1;
  } while (fVar8 < 0.00390625);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&result.super__Vector_base<float,_std::allocator<float>_>);
  return 0x5f < uVar6;
}

Assistant:

bool StorageMultisampleTest::Check()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching data fro auxiliary texture. */
	std::vector<T> result(TestReferenceDataCount<S, D>());

	gl.bindTexture(InputTextureTarget<D>() /* Auxiliary target is the same as input. */, m_to_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.getTexImage(InputTextureTarget<D>() /* Auxiliary target is the same as input. */, 0, Format<S, N>(), Type<T>(),
				   (glw::GLvoid*)(&result[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage has failed");

	/* Comparison. */
	for (glw::GLuint i = 0; i < TestReferenceDataCount<S, D>(); ++i)
	{
		if (!Compare<T>(result[i], ReferenceData<T, N>()[i]))
		{
			return false;
		}
	}

	return true;
}